

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

HighsInt __thiscall
HEkk::addBadBasisChange
          (HEkk *this,HighsInt row_out,HighsInt variable_out,HighsInt variable_in,
          BadBasisChangeReason reason,bool taboo)

{
  iterator __position;
  ulong uVar1;
  pointer pHVar2;
  uint uVar3;
  BadBasisChangeReason *pBVar4;
  HighsSimplexBadBasisChangeRecord record;
  HighsSimplexBadBasisChangeRecord local_30;
  
  pHVar2 = (this->bad_basis_change_).
           super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->bad_basis_change_).
       super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (uint)((ulong)((long)__position._M_current - (long)pHVar2) >> 5);
  if (0 < (int)uVar3) {
    pBVar4 = &pHVar2->reason;
    uVar1 = 0;
    do {
      if ((((pBVar4[-3] == row_out) && (pBVar4[-2] == variable_out)) && (pBVar4[-1] == variable_in))
         && (*pBVar4 == reason)) goto LAB_0033d539;
      uVar1 = uVar1 + 1;
      pBVar4 = pBVar4 + 8;
    } while ((uVar3 & 0x7fffffff) != uVar1);
    uVar1 = 0xffffffff;
LAB_0033d539:
    if (-1 < (int)uVar1) {
      pHVar2[uVar1 & 0xffffffff].taboo = taboo;
      return (int)uVar1;
    }
  }
  local_30.taboo = taboo;
  if (__position._M_current ==
      (this->bad_basis_change_).
      super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_30.row_out = row_out;
    local_30.variable_out = variable_out;
    local_30.variable_in = variable_in;
    local_30.reason = reason;
    std::vector<HighsSimplexBadBasisChangeRecord,std::allocator<HighsSimplexBadBasisChangeRecord>>::
    _M_realloc_insert<HighsSimplexBadBasisChangeRecord_const&>
              ((vector<HighsSimplexBadBasisChangeRecord,std::allocator<HighsSimplexBadBasisChangeRecord>>
                *)&this->bad_basis_change_,__position,&local_30);
    pHVar2 = (this->bad_basis_change_).
             super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(ulong *)&(__position._M_current)->reason = CONCAT44(local_30._20_4_,reason);
    (__position._M_current)->save_value = local_30.save_value;
    (__position._M_current)->taboo = taboo;
    *(undefined3 *)&(__position._M_current)->field_0x1 = local_30._1_3_;
    (__position._M_current)->row_out = row_out;
    (__position._M_current)->variable_out = variable_out;
    (__position._M_current)->variable_in = variable_in;
    pHVar2 = (this->bad_basis_change_).
             super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->bad_basis_change_).
    super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
    ._M_impl.super__Vector_impl_data._M_finish = pHVar2;
  }
  return (int)((ulong)((long)pHVar2 -
                      (long)(this->bad_basis_change_).
                            super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1;
}

Assistant:

HighsInt HEkk::addBadBasisChange(const HighsInt row_out,
                                 const HighsInt variable_out,
                                 const HighsInt variable_in,
                                 const BadBasisChangeReason reason,
                                 const bool taboo) {
  assert(0 <= row_out && row_out <= lp_.num_row_);
  assert(0 <= variable_out && variable_out <= lp_.num_col_ + lp_.num_row_);
  if (variable_in >= 0) {
    assert(0 <= variable_in && variable_in <= lp_.num_col_ + lp_.num_row_);
  } else {
    assert(variable_in == -1);
  }
  // Check that this is not already on the list
  const HighsInt num_bad_basis_change = bad_basis_change_.size();
  HighsInt bad_basis_change_num = -1;
  for (HighsInt Ix = 0; Ix < num_bad_basis_change; Ix++) {
    HighsSimplexBadBasisChangeRecord& record = bad_basis_change_[Ix];
    if (record.row_out == row_out && record.variable_out == variable_out &&
        record.variable_in == variable_in && record.reason == reason) {
      bad_basis_change_num = Ix;
      break;
    }
  }
  if (bad_basis_change_num < 0) {
    // Not on the list so create record
    HighsSimplexBadBasisChangeRecord record;
    record.taboo = taboo;
    record.row_out = row_out;
    record.variable_out = variable_out;
    record.variable_in = variable_in;
    record.reason = reason;
    bad_basis_change_.push_back(record);
    bad_basis_change_num = bad_basis_change_.size() - 1;
  } else {
    // On the list so just update whether it is taboo
    bad_basis_change_[bad_basis_change_num].taboo = taboo;
  }
  return bad_basis_change_num;
}